

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QStringList * __thiscall
QAccessibleToolButton::actionNames(QStringList *__return_storage_ptr__,QAccessibleToolButton *this)

{
  ToolButtonPopupMode TVar1;
  QWidget *pQVar2;
  QToolButton *pQVar3;
  QMenu *pQVar4;
  QString *args;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  if ((pQVar2->data->widget_attributes & 1) == 0) {
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
    pQVar3 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    pQVar4 = QToolButton::menu(pQVar3);
    if (pQVar4 != (QMenu *)0x0) {
      args = (QString *)QAccessibleActionInterface::showMenuAction();
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,args);
      QList<QString>::end(__return_storage_ptr__);
    }
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
    pQVar3 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    TVar1 = QToolButton::popupMode(pQVar3);
    if (TVar1 != InstantPopup) {
      QAccessibleButton::actionNames((QStringList *)&QStack_38,&this->super_QAccessibleButton);
      QList<QString>::operator+=(__return_storage_ptr__,(QList<QString> *)&QStack_38);
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAccessibleToolButton::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
#if QT_CONFIG(menu)
        if (toolButton()->menu())
            names << showMenuAction();
        if (toolButton()->popupMode() != QToolButton::InstantPopup)
            names << QAccessibleButton::actionNames();
#endif
    }
    return names;
}